

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

void bhf::ads::ParseHexData(RegistryEntry *value,char **it,istream *input,size_t *lineNumber)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  uint8_t uVar4;
  byte bVar5;
  int iVar6;
  istream *piVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  char *pcVar10;
  long lVar11;
  string local_1f8 [32];
  string line;
  stringstream ss;
  ostream local_1a8 [376];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cVar3 = **it;
  pcVar10 = *it;
  do {
    while (cVar3 == ',') {
      *it = pcVar10 + 1;
      cVar3 = pcVar10[1];
      pcVar10 = pcVar10 + 1;
      if (cVar3 == ',') {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        if (*lineNumber == 0xffffffffffffffff) {
          poVar8 = std::operator<<(local_1a8,"Invalid network data: ");
          poVar8 = std::operator<<(poVar8,"two subsequent commas");
        }
        else {
          poVar8 = std::operator<<(local_1a8,"Invalid file format: ");
          poVar8 = std::operator<<(poVar8,"two subsequent commas");
          poVar8 = std::operator<<(poVar8," in line ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        }
        std::operator<<(poVar8,'\n');
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1f8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (cVar3 == '\\') {
      *it = pcVar10 + 1;
      if (pcVar10[1] != '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        if (*lineNumber == 0xffffffffffffffff) {
          poVar8 = std::operator<<(local_1a8,"Invalid network data: ");
          poVar8 = std::operator<<(poVar8,
                                   "data continuation line should be the las character in line");
        }
        else {
          poVar8 = std::operator<<(local_1a8,"Invalid file format: ");
          poVar8 = std::operator<<(poVar8,
                                   "data continuation line should be the las character in line");
          poVar8 = std::operator<<(poVar8," in line ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        }
        std::operator<<(poVar8,'\n');
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1f8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(input,(string *)&line)
      ;
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        if (*lineNumber == 0xffffffffffffffff) {
          poVar8 = std::operator<<(local_1a8,"Invalid network data: ");
          poVar8 = std::operator<<(poVar8,"data continuation line next line is missing");
        }
        else {
          poVar8 = std::operator<<(local_1a8,"Invalid file format: ");
          poVar8 = std::operator<<(poVar8,"data continuation line next line is missing");
          poVar8 = std::operator<<(poVar8," in line ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        }
        std::operator<<(poVar8,'\n');
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1f8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *it = line._M_dataplus._M_p;
      if ((*line._M_dataplus._M_p != ' ') || (line._M_dataplus._M_p[1] != ' ')) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        if (*lineNumber == 0xffffffffffffffff) {
          poVar8 = std::operator<<(local_1a8,"Invalid network data: ");
          poVar8 = std::operator<<(poVar8,"data continuation line should start with two spaces");
        }
        else {
          poVar8 = std::operator<<(local_1a8,"Invalid file format: ");
          poVar8 = std::operator<<(poVar8,"data continuation line should start with two spaces");
          poVar8 = std::operator<<(poVar8," in line ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        }
        std::operator<<(poVar8,'\n');
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1f8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar10 = line._M_dataplus._M_p + 2;
      *it = pcVar10;
    }
    else if (cVar3 == '\0') {
      VerifyDataLen(value->type,value->dataLen,*lineNumber);
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    lVar2 = 0;
    while (lVar11 = lVar2, lVar11 != 2) {
      iVar6 = isxdigit((int)pcVar10[lVar11]);
      lVar2 = lVar11 + 1;
      if (iVar6 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        if (*lineNumber == 0xffffffffffffffff) {
          poVar8 = std::operator<<(local_1a8,"Invalid network data: ");
          poVar8 = std::operator<<(poVar8,"invalid hex character \'");
          poVar8 = std::operator<<(poVar8,(*it)[lVar11]);
          poVar8 = std::operator<<(poVar8,"\'");
        }
        else {
          poVar8 = std::operator<<(local_1a8,"Invalid file format: ");
          poVar8 = std::operator<<(poVar8,"invalid hex character \'");
          poVar8 = std::operator<<(poVar8,(*it)[lVar11]);
          poVar8 = std::operator<<(poVar8,"\'");
          poVar8 = std::operator<<(poVar8," in line ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        }
        std::operator<<(poVar8,'\n');
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1f8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    uVar4 = hex2val(*pcVar10);
    bVar5 = hex2val(pcVar10[1]);
    RegistryEntry::PushData<unsigned_char>(value,bVar5 & 0xf | uVar4 << 4);
    pcVar1 = *it;
    pcVar10 = pcVar1 + 2;
    *it = pcVar10;
    cVar3 = pcVar1[2];
  } while ((cVar3 == '\0') || (cVar3 == ','));
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (*lineNumber == 0xffffffffffffffff) {
    poVar8 = std::operator<<(local_1a8,"Invalid network data: ");
    poVar8 = std::operator<<(poVar8,"two subsequent values");
  }
  else {
    poVar8 = std::operator<<(local_1a8,"Invalid file format: ");
    poVar8 = std::operator<<(poVar8,"two subsequent values");
    poVar8 = std::operator<<(poVar8," in line ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  }
  std::operator<<(poVar8,'\n');
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,local_1f8);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ParseHexData(bhf::ads::RegistryEntry& value, const char*& it, std::istream& input, size_t& lineNumber)
{
    std::string line{};
    for ( ; '\0' != *it; ) {
        // Skip commas but ensure there is exactly one
        if (',' == *it) {
            ++it;
            if (',' == *it) {
                PARSING_EXCEPTION("two subsequent commas");
            }
            continue;
        }

        // Data is allowed to containe linebreaks. However, we treat comments or empty lines
        // in such a multiline data section as error.
        if ('\\' == *it) {
            ++it;
            if ('\0' != *it) {
                PARSING_EXCEPTION("data continuation line should be the las character in line");
            }

            if (!std::getline(input, line)) {
                PARSING_EXCEPTION("data continuation line next line is missing");
            }
            it = line.c_str();
            if (strncmp("  ", it, 2)) {
                PARSING_EXCEPTION("data continuation line should start with two spaces");
            }
            it += 2;
        }

        // We only accept hex data values consisting of two characters (trailing 0)
        for (auto i = 0; i < 2; ++i) {
            if (!isxdigit(it[i])) {
                PARSING_EXCEPTION("invalid hex character '" << it[i] << "'");
            }
        }
        const uint8_t byte = (hex2val(it[0]) << 4) | (hex2val(it[1]) & 0xF);
        value.PushData(byte);
        it += 2;

        // Hex data values should be separated by a comma
        if (*it && (',' != *it)) {
            PARSING_EXCEPTION("two subsequent values");
        }
    }
    VerifyDataLen(value.type, value.dataLen, lineNumber);
}